

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Lexer::ParseName(Lexer *this)

{
  bool bVar1;
  int iVar2;
  string_view local_38;
  size_type local_28;
  size_t count;
  char *startName;
  Lexer *pLStack_10;
  bool quotedName;
  Lexer *this_local;
  
  startName._7_1_ = 0;
  pLStack_10 = this;
  if (*this->m_current == '\'') {
    startName._7_1_ = 1;
    AdvanceCurrent(this);
  }
  count = (size_t)this->m_current;
  bVar1 = IsNameStart(this,this->m_current);
  if (!bVar1) {
    Error<>(this,"Invalid character in name");
  }
  AdvanceCurrent(this);
  while (bVar1 = IsEndOfText(this), ((bVar1 ^ 0xffU) & 1) != 0) {
    if ((startName._7_1_ & 1) == 0) {
      bVar1 = IsName(this,this->m_current);
      if (!bVar1) break;
    }
    else if (*this->m_current == '\'') break;
    AdvanceCurrent(this);
  }
  local_28 = (long)this->m_current - count;
  if ((startName._7_1_ & 1) != 0) {
    AdvanceCurrent(this);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,(char *)count,local_28);
  CreateSymbol(this,local_38);
  if (((startName._7_1_ & 1) == 0) && (*this->m_current == '\'')) {
    AdvanceCurrent(this);
    bVar1 = IsEndOfText(this);
    if (bVar1) {
      return;
    }
  }
  iVar2 = tolower((int)*this->m_current);
  if (iVar2 == 0x73) {
    AdvanceCurrent(this);
  }
  return;
}

Assistant:

inline_t void Lexer::ParseName()
	{
		bool quotedName = false;
		if (*m_current == '\'')
		{
			quotedName = true;
			AdvanceCurrent();
		}

		const char * startName = m_current;

		if (!IsNameStart(m_current))
			Error("Invalid character in name");
		AdvanceCurrent();

		// Advance until we reach the end of the text or hit a non-name character
		while (!IsEndOfText())
		{
			if (quotedName)
			{
				if (*m_current == '\'')
					break;
			}
			else
			{
				if (!IsName(m_current))
					break;
			}
			AdvanceCurrent();
		}
		size_t count = m_current - startName;
		if (quotedName)
			AdvanceCurrent();
		CreateSymbol(std::string_view(startName, count));

		// Check for apostrophe-s.  If the name is quoted, no additional quote is needed
		if (!quotedName)
		{
			if (*m_current == '\'')
			{
				AdvanceCurrent();
				if (IsEndOfText())
					return;
			}
		}
		if (std::tolower(*m_current) == 's')
			AdvanceCurrent();
	}